

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O0

void basisu::compute_bc1_hints
               (bool *bc1_hint0,bool *bc1_hint1,uastc_encode_results *best_results,
               color_rgba (*block) [4],color_rgba (*decoded_uastc_block) [4])

{
  uint32_t uVar1;
  uint *in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float err_thresh1;
  float err_thresh0;
  float t_err_hint1;
  float t_err_hint0;
  float t_err;
  uint32_t x;
  uint32_t y;
  uint64_t total_hint1_err;
  uint64_t total_hint0_err;
  uint64_t total_t_err;
  dxt1_block b;
  unpacked_uastc_block ublock;
  unpacked_uastc_block temp_ublock_unpacked;
  uastc_block temp_ublock;
  eac_a8_block etc2_blk;
  etc_block etc1_blk;
  color_rgba tblock_hint1_bc1 [4] [4];
  color_rgba tblock_hint0_bc1 [4] [4];
  dxt1_block tbc1_block [8];
  color_rgba tblock_bc1 [4] [4];
  bool perceptual;
  uint32_t best_mode;
  color_rgba *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  texture_format in_stack_fffffffffffffce0;
  float local_31c;
  undefined4 in_stack_fffffffffffffcec;
  color32 *this;
  color32 *e1;
  color32 *pcVar5;
  unpacked_uastc_block *unpacked_src_blk;
  color32 *local_2e8;
  color_rgba *local_2d0;
  uint local_2b0;
  uint local_2ac;
  void *in_stack_fffffffffffffd58;
  ulong uVar6;
  unpacked_uastc_block *in_stack_fffffffffffffd60;
  ulong uVar7;
  ulong local_298;
  undefined1 local_288 [104];
  uint local_220;
  uint local_21c;
  color32 cStack_218;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  unpacked_uastc_block *in_stack_fffffffffffffdf0;
  uastc_block *in_stack_fffffffffffffdf8;
  undefined1 local_1f0 [84];
  uint32_t in_stack_fffffffffffffe64;
  uint8_t *in_stack_fffffffffffffe68;
  void *in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  eac_a8_block *in_stack_fffffffffffffeb0;
  ushort local_148 [2];
  uint32_t in_stack_fffffffffffffebc;
  etc_block *in_stack_fffffffffffffec0;
  uastc_encode_results *in_stack_fffffffffffffec8;
  uastc_block *in_stack_fffffffffffffed0;
  color32 local_f8 [16];
  undefined1 local_b8 [128];
  color_rgba acStack_38 [2];
  undefined1 local_2d;
  uint local_2c;
  uint *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_2c = *in_RDX;
  local_2d = 0;
  *in_RDI = 0;
  *in_RSI = 0;
  if ((local_2c != 8) &&
     ((basist::g_uastc_mode_has_bc1_hint0[local_2c] != '\0' ||
      (basist::g_uastc_mode_has_bc1_hint1[local_2c] != '\0')))) {
    local_2d0 = (color_rgba *)(local_b8 + 0x40);
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    do {
      color_rgba::color_rgba(local_2d0);
      local_2d0 = local_2d0 + 1;
    } while (local_2d0 != acStack_38);
    basist::encode_bc1(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64
                      );
    unpack_block(in_stack_fffffffffffffce0,
                 (void *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 in_stack_fffffffffffffcd0);
    unpacked_src_blk = (unpacked_uastc_block *)(local_f8 + 0x10);
    pcVar5 = local_f8;
    do {
      local_2e8 = pcVar5;
      color_rgba::color_rgba((color_rgba *)local_2e8);
      pcVar5 = local_2e8 + 1;
    } while ((unpacked_uastc_block *)(local_2e8 + 1) != unpacked_src_blk);
    e1 = local_f8;
    pcVar5 = (color32 *)&stack0xfffffffffffffec8;
    do {
      this = pcVar5;
      color_rgba::color_rgba((color_rgba *)this);
      pcVar5 = this + 1;
    } while (pcVar5 != e1);
    memset(&stack0xfffffffffffffec0,0,8);
    memset(local_148,0,8);
    local_148[0] = local_148[0] & 0xfff | 0x1000;
    pack_uastc(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,(bool)in_stack_fffffffffffffeaf,
               (bool)in_stack_fffffffffffffeae);
    basist::unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x5360ae);
    basist::unpack_uastc
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef,
               (bool)in_stack_fffffffffffffdee);
    memset(local_288,0,0x98);
    basist::color32::color32(&cStack_218);
    local_220 = *local_18;
    local_21c = local_18[1];
    memcpy(local_288,local_1f0,0x68);
    if (basist::g_uastc_mode_has_bc1_hint1[local_2c] == '\0') {
      memset(&stack0xfffffffffffffec8,0,0x40);
    }
    else {
      basist::transcode_uastc_to_bc1_hint1
                (unpacked_src_blk,(color32 (*) [4])local_2e8,pcVar5,SUB81((ulong)e1 >> 0x38,0));
      unpack_block(in_stack_fffffffffffffce0,
                   (void *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd0);
    }
    if (basist::g_uastc_mode_has_bc1_hint0[local_2c] == '\0') {
      memset(local_f8,0,0x40);
    }
    else {
      basist::transcode_uastc_to_bc1_hint0(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      unpack_block(in_stack_fffffffffffffce0,
                   (void *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd0);
    }
    local_298 = 0;
    uVar7 = 0;
    uVar6 = 0;
    for (local_2ac = 0; local_2ac < 4; local_2ac = local_2ac + 1) {
      for (local_2b0 = 0; local_2b0 < 4; local_2b0 = local_2b0 + 1) {
        uVar1 = color_distance(SUB81((ulong)pcVar5 >> 0x18,0),(color_rgba *)e1,(color_rgba *)this,
                               SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0));
        local_298 = uVar1 + local_298;
        uVar1 = color_distance(SUB81((ulong)pcVar5 >> 0x18,0),(color_rgba *)e1,(color_rgba *)this,
                               SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0));
        uVar7 = uVar1 + uVar7;
        uVar1 = color_distance(SUB81((ulong)pcVar5 >> 0x18,0),(color_rgba *)e1,(color_rgba *)this,
                               SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0));
        uVar6 = uVar1 + uVar6;
      }
    }
    fVar2 = sqrtf((float)local_298);
    local_31c = (float)uVar7;
    fVar3 = sqrtf(local_31c);
    fVar4 = sqrtf((float)uVar6);
    if ((basist::g_uastc_mode_has_bc1_hint0[local_2c] != '\0') && (fVar3 <= fVar2 * 1.075)) {
      *local_8 = 1;
    }
    if ((basist::g_uastc_mode_has_bc1_hint1[local_2c] != '\0') && (fVar4 <= fVar2 * 1.075)) {
      *local_10 = 1;
    }
  }
  return;
}

Assistant:

static void compute_bc1_hints(bool &bc1_hint0, bool &bc1_hint1, const uastc_encode_results &best_results, const color_rgba block[4][4], const color_rgba decoded_uastc_block[4][4])
	{
		const uint32_t best_mode = best_results.m_uastc_mode;
		const bool perceptual = false;

		bc1_hint0 = false;
		bc1_hint1 = false;

		if (best_mode == UASTC_MODE_INDEX_SOLID_COLOR)
			return;

		if (!g_uastc_mode_has_bc1_hint0[best_mode] && !g_uastc_mode_has_bc1_hint1[best_mode])
			return;

		color_rgba tblock_bc1[4][4];
		dxt1_block tbc1_block[8];
		basist::encode_bc1(tbc1_block, (const uint8_t*)&decoded_uastc_block[0][0], 0);
		unpack_block(texture_format::cBC1, tbc1_block, &tblock_bc1[0][0]);

		color_rgba tblock_hint0_bc1[4][4];
		color_rgba tblock_hint1_bc1[4][4];
		
		etc_block etc1_blk;
		memset(&etc1_blk, 0, sizeof(etc1_blk));

		eac_a8_block etc2_blk;
		memset(&etc2_blk, 0, sizeof(etc2_blk));
		etc2_blk.m_multiplier = 1;
		
		// Pack to UASTC, then unpack, because the endpoints may be swapped.

		uastc_block temp_ublock;
		pack_uastc(temp_ublock, best_results, etc1_blk, 0, etc2_blk, false, false);

		unpacked_uastc_block temp_ublock_unpacked;
		unpack_uastc(temp_ublock, temp_ublock_unpacked, false);
										
		unpacked_uastc_block ublock = {};
		ublock.m_mode = best_results.m_uastc_mode;
		ublock.m_common_pattern = best_results.m_common_pattern;
		ublock.m_astc = temp_ublock_unpacked.m_astc;

		dxt1_block b;

		// HINT1
		if (!g_uastc_mode_has_bc1_hint1[best_mode])
		{
			memset(tblock_hint1_bc1, 0, sizeof(tblock_hint1_bc1));
		}
		else
		{
			transcode_uastc_to_bc1_hint1(ublock, (color32 (*)[4]) decoded_uastc_block, &b, false);

			unpack_block(texture_format::cBC1, &b, &tblock_hint1_bc1[0][0]);
		}

		// HINT0
		if (!g_uastc_mode_has_bc1_hint0[best_mode])
		{
			memset(tblock_hint0_bc1, 0, sizeof(tblock_hint0_bc1));
		}
		else
		{
			transcode_uastc_to_bc1_hint0(ublock, &b);
			
			unpack_block(texture_format::cBC1, &b, &tblock_hint0_bc1[0][0]);
		}

		// Compute block errors
		uint64_t total_t_err = 0, total_hint0_err = 0, total_hint1_err = 0;
		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				total_t_err += color_distance(perceptual, block[y][x], tblock_bc1[y][x], false);
				total_hint0_err += color_distance(perceptual, block[y][x], tblock_hint0_bc1[y][x], false);
				total_hint1_err += color_distance(perceptual, block[y][x], tblock_hint1_bc1[y][x], false);
			}
		}

		const float t_err = sqrtf((float)total_t_err);
		const float t_err_hint0 = sqrtf((float)total_hint0_err);
		const float t_err_hint1 = sqrtf((float)total_hint1_err);

		const float err_thresh0 = 1.075f;
		const float err_thresh1 = 1.075f;
		
		if ((g_uastc_mode_has_bc1_hint0[best_mode]) && (t_err_hint0 <= t_err * err_thresh0))
			bc1_hint0 = true;

		if ((g_uastc_mode_has_bc1_hint1[best_mode]) && (t_err_hint1 <= t_err * err_thresh1))
			bc1_hint1 = true;
	}